

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprBalance(Fts3Expr **pp,int nMaxDepth)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  uint in_ESI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  Fts3Expr *pDel;
  Fts3Expr *pParent;
  int iLvl;
  int i;
  Fts3Expr **apLeaf;
  int eType;
  Fts3Expr *pFree;
  Fts3Expr *pRoot;
  int rc;
  Fts3Expr *pRight;
  Fts3Expr *pLeft;
  Fts3Expr *p;
  sqlite3_uint64 in_stack_ffffffffffffff88;
  int local_58;
  int local_54;
  Fts3Expr *in_stack_ffffffffffffffb0;
  int *local_40;
  int *piVar7;
  uint uVar8;
  int *local_10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  piVar7 = (int *)*in_RDI;
  local_40 = (int *)0x0;
  iVar1 = *piVar7;
  uVar8 = (uint)(in_ESI == 0);
  if (uVar8 == 0) {
    if ((iVar1 == 3) || (iVar1 == 4)) {
      in_stack_ffffffffffffffb0 = (Fts3Expr *)sqlite3_malloc64(in_stack_ffffffffffffff88);
      if (in_stack_ffffffffffffffb0 == (Fts3Expr *)0x0) {
        uVar8 = 7;
      }
      else {
        memset(in_stack_ffffffffffffffb0,0,(long)(int)in_ESI << 3);
      }
      local_10 = piVar7;
      if (uVar8 == 0) {
        for (; *local_10 == iVar1; local_10 = *(int **)(local_10 + 4)) {
        }
        while( true ) {
          piVar3 = *(int **)(local_10 + 2);
          local_10[2] = 0;
          local_10[3] = 0;
          if (piVar3 == (int *)0x0) {
            piVar7 = (int *)0x0;
          }
          else {
            piVar3[4] = 0;
            piVar3[5] = 0;
          }
          uVar8 = fts3ExprBalance((Fts3Expr **)((ulong)in_ESI << 0x20),(int)((ulong)piVar7 >> 0x20))
          ;
          if (uVar8 != 0) goto LAB_0024ba9f;
          for (local_58 = 0; local_10 != (int *)0x0 && local_58 < (int)in_ESI;
              local_58 = local_58 + 1) {
            if (*(long *)(&in_stack_ffffffffffffffb0->eType + (long)local_58 * 2) == 0) {
              *(int **)(&in_stack_ffffffffffffffb0->eType + (long)local_58 * 2) = local_10;
              local_10 = (int *)0x0;
            }
            else {
              *(undefined8 *)(local_40 + 4) =
                   *(undefined8 *)(&in_stack_ffffffffffffffb0->eType + (long)local_58 * 2);
              *(int **)(local_40 + 6) = local_10;
              *(int **)(*(long *)(local_40 + 4) + 8) = local_40;
              *(int **)(*(long *)(local_40 + 6) + 8) = local_40;
              local_10 = local_40;
              piVar4 = *(int **)(local_40 + 2);
              local_40[2] = 0;
              local_40[3] = 0;
              *(undefined8 *)(&in_stack_ffffffffffffffb0->eType + (long)local_58 * 2) = 0;
              local_40 = piVar4;
            }
          }
          if (local_10 != (int *)0x0) break;
          if (piVar3 == (int *)0x0) goto LAB_0024ba9f;
          for (local_10 = *(int **)(piVar3 + 6); *local_10 == iVar1;
              local_10 = *(int **)(local_10 + 4)) {
          }
          *(undefined8 *)(*(long *)(piVar3 + 6) + 8) = *(undefined8 *)(piVar3 + 2);
          if (*(long *)(piVar3 + 2) == 0) {
            piVar7 = *(int **)(piVar3 + 6);
          }
          else {
            *(undefined8 *)(*(long *)(piVar3 + 2) + 0x10) = *(undefined8 *)(piVar3 + 6);
          }
          *(int **)(piVar3 + 2) = local_40;
          local_40 = piVar3;
        }
        sqlite3Fts3ExprFree(in_stack_ffffffffffffffb0);
        uVar8 = 0x12;
LAB_0024ba9f:
        if (uVar8 == 0) {
          local_10 = (int *)0x0;
          for (local_54 = 0; local_54 < (int)in_ESI; local_54 = local_54 + 1) {
            if (*(long *)(&in_stack_ffffffffffffffb0->eType + (long)local_54 * 2) != 0) {
              if (local_10 == (int *)0x0) {
                local_10 = *(int **)(&in_stack_ffffffffffffffb0->eType + (long)local_54 * 2);
                local_10[2] = 0;
                local_10[3] = 0;
              }
              else {
                *(int **)(local_40 + 6) = local_10;
                *(undefined8 *)(local_40 + 4) =
                     *(undefined8 *)(&in_stack_ffffffffffffffb0->eType + (long)local_54 * 2);
                *(int **)(*(long *)(local_40 + 4) + 8) = local_40;
                *(int **)(*(long *)(local_40 + 6) + 8) = local_40;
                local_10 = local_40;
                piVar7 = *(int **)(local_40 + 2);
                local_40[2] = 0;
                local_40[3] = 0;
                local_40 = piVar7;
              }
            }
          }
        }
        else {
          local_10 = piVar7;
          for (local_54 = 0; local_54 < (int)in_ESI; local_54 = local_54 + 1) {
            sqlite3Fts3ExprFree(in_stack_ffffffffffffffb0);
          }
          while (local_40 != (int *)0x0) {
            local_40 = *(int **)(local_40 + 2);
            sqlite3_free((void *)0x24bc01);
          }
        }
        sqlite3_free((void *)0x24bc0f);
        piVar7 = local_10;
      }
    }
    else if (iVar1 == 2) {
      lVar5 = *(long *)(piVar7 + 4);
      lVar6 = *(long *)(piVar7 + 6);
      piVar7[4] = 0;
      piVar7[5] = 0;
      piVar7[6] = 0;
      piVar7[7] = 0;
      *(undefined8 *)(lVar5 + 8) = 0;
      *(undefined8 *)(lVar6 + 8) = 0;
      uVar8 = fts3ExprBalance((Fts3Expr **)((ulong)in_ESI << 0x20),(int)((ulong)piVar7 >> 0x20));
      if (uVar8 == 0) {
        uVar8 = fts3ExprBalance((Fts3Expr **)((ulong)in_ESI << 0x20),(int)((ulong)piVar7 >> 0x20));
      }
      if (uVar8 == 0) {
        *(long *)(piVar7 + 4) = lVar5;
        *(int **)(lVar5 + 8) = piVar7;
        *(long *)(piVar7 + 6) = lVar6;
        *(int **)(lVar6 + 8) = piVar7;
      }
      else {
        sqlite3Fts3ExprFree(in_stack_ffffffffffffffb0);
        sqlite3Fts3ExprFree(in_stack_ffffffffffffffb0);
      }
    }
  }
  if (uVar8 != 0) {
    sqlite3Fts3ExprFree(in_stack_ffffffffffffffb0);
    piVar7 = (int *)0x0;
  }
  *in_RDI = piVar7;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return uVar8;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3ExprBalance(Fts3Expr **pp, int nMaxDepth){
  int rc = SQLITE_OK;             /* Return code */
  Fts3Expr *pRoot = *pp;          /* Initial root node */
  Fts3Expr *pFree = 0;            /* List of free nodes. Linked by pParent. */
  int eType = pRoot->eType;       /* Type of node in this tree */

  if( nMaxDepth==0 ){
    rc = SQLITE_ERROR;
  }

  if( rc==SQLITE_OK ){
    if( (eType==FTSQUERY_AND || eType==FTSQUERY_OR) ){
      Fts3Expr **apLeaf;
      apLeaf = (Fts3Expr **)sqlite3_malloc64(sizeof(Fts3Expr *) * nMaxDepth);
      if( 0==apLeaf ){
        rc = SQLITE_NOMEM;
      }else{
        memset(apLeaf, 0, sizeof(Fts3Expr *) * nMaxDepth);
      }

      if( rc==SQLITE_OK ){
        int i;
        Fts3Expr *p;

        /* Set $p to point to the left-most leaf in the tree of eType nodes. */
        for(p=pRoot; p->eType==eType; p=p->pLeft){
          assert( p->pParent==0 || p->pParent->pLeft==p );
          assert( p->pLeft && p->pRight );
        }

        /* This loop runs once for each leaf in the tree of eType nodes. */
        while( 1 ){
          int iLvl;
          Fts3Expr *pParent = p->pParent;     /* Current parent of p */

          assert( pParent==0 || pParent->pLeft==p );
          p->pParent = 0;
          if( pParent ){
            pParent->pLeft = 0;
          }else{
            pRoot = 0;
          }
          rc = fts3ExprBalance(&p, nMaxDepth-1);
          if( rc!=SQLITE_OK ) break;

          for(iLvl=0; p && iLvl<nMaxDepth; iLvl++){
            if( apLeaf[iLvl]==0 ){
              apLeaf[iLvl] = p;
              p = 0;
            }else{
              assert( pFree );
              pFree->pLeft = apLeaf[iLvl];
              pFree->pRight = p;
              pFree->pLeft->pParent = pFree;
              pFree->pRight->pParent = pFree;

              p = pFree;
              pFree = pFree->pParent;
              p->pParent = 0;
              apLeaf[iLvl] = 0;
            }
          }
          if( p ){
            sqlite3Fts3ExprFree(p);
            rc = SQLITE_TOOBIG;
            break;
          }

          /* If that was the last leaf node, break out of the loop */
          if( pParent==0 ) break;

          /* Set $p to point to the next leaf in the tree of eType nodes */
          for(p=pParent->pRight; p->eType==eType; p=p->pLeft);

          /* Remove pParent from the original tree. */
          assert( pParent->pParent==0 || pParent->pParent->pLeft==pParent );
          pParent->pRight->pParent = pParent->pParent;
          if( pParent->pParent ){
            pParent->pParent->pLeft = pParent->pRight;
          }else{
            assert( pParent==pRoot );
            pRoot = pParent->pRight;
          }

          /* Link pParent into the free node list. It will be used as an
          ** internal node of the new tree.  */
          pParent->pParent = pFree;
          pFree = pParent;
        }

        if( rc==SQLITE_OK ){
          p = 0;
          for(i=0; i<nMaxDepth; i++){
            if( apLeaf[i] ){
              if( p==0 ){
                p = apLeaf[i];
                p->pParent = 0;
              }else{
                assert( pFree!=0 );
                pFree->pRight = p;
                pFree->pLeft = apLeaf[i];
                pFree->pLeft->pParent = pFree;
                pFree->pRight->pParent = pFree;

                p = pFree;
                pFree = pFree->pParent;
                p->pParent = 0;
              }
            }
          }
          pRoot = p;
        }else{
          /* An error occurred. Delete the contents of the apLeaf[] array
          ** and pFree list. Everything else is cleaned up by the call to
          ** sqlite3Fts3ExprFree(pRoot) below.  */
          Fts3Expr *pDel;
          for(i=0; i<nMaxDepth; i++){
            sqlite3Fts3ExprFree(apLeaf[i]);
          }
          while( (pDel=pFree)!=0 ){
            pFree = pDel->pParent;
            sqlite3_free(pDel);
          }
        }

        assert( pFree==0 );
        sqlite3_free( apLeaf );
      }
    }else if( eType==FTSQUERY_NOT ){
      Fts3Expr *pLeft = pRoot->pLeft;
      Fts3Expr *pRight = pRoot->pRight;

      pRoot->pLeft = 0;
      pRoot->pRight = 0;
      pLeft->pParent = 0;
      pRight->pParent = 0;

      rc = fts3ExprBalance(&pLeft, nMaxDepth-1);
      if( rc==SQLITE_OK ){
        rc = fts3ExprBalance(&pRight, nMaxDepth-1);
      }

      if( rc!=SQLITE_OK ){
        sqlite3Fts3ExprFree(pRight);
        sqlite3Fts3ExprFree(pLeft);
      }else{
        assert( pLeft && pRight );
        pRoot->pLeft = pLeft;
        pLeft->pParent = pRoot;
        pRoot->pRight = pRight;
        pRight->pParent = pRoot;
      }
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3Fts3ExprFree(pRoot);
    pRoot = 0;
  }
  *pp = pRoot;
  return rc;
}